

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laswriteitemcompressed_v1.cpp
# Opt level: O3

void __thiscall
LASwriteItemCompressed_POINT10_v1::~LASwriteItemCompressed_POINT10_v1
          (LASwriteItemCompressed_POINT10_v1 *this)

{
  IntegerCompressor *pIVar1;
  long lVar2;
  
  (this->super_LASwriteItemCompressed).super_LASwriteItem._vptr_LASwriteItem =
       (_func_int **)&PTR_write_0015d020;
  pIVar1 = this->ic_dx;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
  }
  operator_delete(pIVar1);
  pIVar1 = this->ic_dy;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
  }
  operator_delete(pIVar1);
  pIVar1 = this->ic_z;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
  }
  operator_delete(pIVar1);
  pIVar1 = this->ic_intensity;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
  }
  operator_delete(pIVar1);
  pIVar1 = this->ic_scan_angle_rank;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
  }
  operator_delete(pIVar1);
  pIVar1 = this->ic_point_source_ID;
  if (pIVar1 != (IntegerCompressor *)0x0) {
    IntegerCompressor::~IntegerCompressor(pIVar1);
  }
  operator_delete(pIVar1);
  ArithmeticEncoder::destroySymbolModel(this->enc,this->m_changed_values);
  lVar2 = -0x100;
  do {
    if (this->m_classification[lVar2] != (ArithmeticModel *)0x0) {
      ArithmeticEncoder::destroySymbolModel(this->enc,this->m_classification[lVar2]);
    }
    if (this->m_user_data[lVar2] != (ArithmeticModel *)0x0) {
      ArithmeticEncoder::destroySymbolModel(this->enc,this->m_user_data[lVar2]);
    }
    if (*(ArithmeticModel **)(this[1].last_item + lVar2 * 8 + -0x10) != (ArithmeticModel *)0x0) {
      ArithmeticEncoder::destroySymbolModel
                (this->enc,*(ArithmeticModel **)(this[1].last_item + lVar2 * 8 + -0x10));
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0);
  return;
}

Assistant:

LASwriteItemCompressed_POINT10_v1::~LASwriteItemCompressed_POINT10_v1()
{
  U32 i;
  delete ic_dx;
  delete ic_dy;
  delete ic_z;
  delete ic_intensity;
  delete ic_scan_angle_rank;
  delete ic_point_source_ID;
  enc->destroySymbolModel(m_changed_values);
  for (i = 0; i < 256; i++)
  {
    if (m_bit_byte[i]) enc->destroySymbolModel(m_bit_byte[i]);
    if (m_classification[i]) enc->destroySymbolModel(m_classification[i]);
    if (m_user_data[i]) enc->destroySymbolModel(m_user_data[i]);
  }
}